

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O1

int32_t icu_63::MeasureUnit::internalGetIndexForTypeAndSubtype(char *type,char *subtype)

{
  int start;
  uint uVar1;
  ulong uVar2;
  
  uVar1 = binarySearch((char **)gTypes,0,0x14,type);
  if (-1 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
    start = (&gOffsets)[uVar2];
    uVar1 = binarySearch((char **)gSubTypes,start,(&DAT_00302524)[uVar2],subtype);
    if (-1 < (int)uVar1) {
      uVar1 = (uVar1 - start) + *(int *)(gIndexes + uVar2 * 4);
    }
  }
  return uVar1;
}

Assistant:

int32_t MeasureUnit::internalGetIndexForTypeAndSubtype(const char *type, const char *subtype) {
    int32_t t = binarySearch(gTypes, 0, UPRV_LENGTHOF(gTypes), type);
    if (t < 0) {
        return t;
    }
    int32_t st = binarySearch(gSubTypes, gOffsets[t], gOffsets[t + 1], subtype);
    if (st < 0) {
        return st;
    }
    return gIndexes[t] + st - gOffsets[t];
}